

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O3

FT_Bool tt_check_single_notdef(FT_Face ttface)

{
  FT_ListNode pFVar1;
  FT_Error FVar2;
  FT_ListNode pFVar3;
  undefined8 in_RDX;
  undefined8 uVar4;
  FT_ListNode pFVar5;
  FT_ListNode pFVar6;
  bool bVar7;
  char local_40;
  undefined7 uStack_3f;
  char buf [8];
  FT_UInt asize;
  
  pFVar1 = ttface[4].sizes_list.tail;
  if (pFVar1 == (FT_ListNode)0x0) {
LAB_0022ee4b:
    bVar7 = false;
  }
  else {
    uVar4 = CONCAT71((int7)((ulong)in_RDX >> 8),1);
    bVar7 = false;
    pFVar3 = (FT_ListNode)0x0;
    pFVar5 = (FT_ListNode)0x0;
    do {
      buf._4_4_ = (undefined4)uVar4;
      pFVar6 = pFVar3;
      while (tt_face_get_location((TT_Face)ttface,(FT_UInt)pFVar6,(FT_UInt *)buf), buf._0_4_ == 0) {
        pFVar6 = (FT_ListNode)((long)&pFVar6->prev + 1);
        if (pFVar1 == pFVar6) {
          pFVar6 = pFVar5;
          if (!bVar7) goto LAB_0022ee4b;
          goto LAB_0022ee11;
        }
      }
      if ((buf._4_4_ & 1) == 0) goto LAB_0022ee4b;
      pFVar3 = (FT_ListNode)((long)&pFVar6->prev + 1);
      bVar7 = true;
      uVar4 = 0;
      pFVar5 = pFVar6;
    } while ((FT_ListNode)((long)&pFVar1[-1].data + 7) != pFVar6);
LAB_0022ee11:
    if (pFVar6 == (FT_ListNode)0x0) {
      bVar7 = true;
    }
    else {
      FVar2 = FT_Get_Glyph_Name(ttface,(FT_UInt)pFVar6,&local_40,8);
      bVar7 = false;
      if ((FVar2 == 0) && (local_40 == '.')) {
        bVar7 = CONCAT71(uStack_3f,0x2e) == 0x666564746f6e2e;
      }
    }
  }
  return bVar7;
}

Assistant:

static FT_Bool
  tt_check_single_notdef( FT_Face  ttface )
  {
    FT_Bool   result = FALSE;

    TT_Face   face = (TT_Face)ttface;
    FT_UInt   asize;
    FT_ULong  i;
    FT_ULong  glyph_index = 0;
    FT_UInt   count       = 0;


    for( i = 0; i < face->num_locations; i++ )
    {
      tt_face_get_location( face, i, &asize );
      if ( asize > 0 )
      {
        count += 1;
        if ( count > 1 )
          break;
        glyph_index = i;
      }
    }

    /* Only have a single outline. */
    if ( count == 1 )
    {
      if ( glyph_index == 0 )
        result = TRUE;
      else
      {
        /* FIXME: Need to test glyphname == .notdef ? */
        FT_Error error;
        char buf[8];


        error = FT_Get_Glyph_Name( ttface, glyph_index, buf, 8 );
        if ( !error                                            &&
             buf[0] == '.' && !ft_strncmp( buf, ".notdef", 8 ) )
          result = TRUE;
      }
    }

    return result;
  }